

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

bool __thiscall cmFindPackageCommand::CheckVersion(cmFindPackageCommand *this,string *config_file)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  string version_file;
  string version;
  string version_file_base;
  ConfigFileInfo configFileInfo;
  string local_d8;
  string local_b8;
  size_type local_98;
  long *local_90;
  long local_88;
  long local_80 [2];
  undefined1 local_70 [32];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"unknown","");
  std::__cxx11::string::rfind((char)config_file,0x2e);
  std::__cxx11::string::substr((ulong)&local_90,(ulong)config_file);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_90,local_88 + (long)local_90);
  std::__cxx11::string::append((char *)&local_d8);
  bVar1 = cmsys::SystemTools::FileExists(&local_d8,true);
  if (!bVar1) {
    bVar2 = false;
  }
  else {
    bVar2 = CheckVersionFile(this,&local_d8,&local_b8);
  }
  bVar1 = bVar1;
  std::__cxx11::string::_M_assign((string *)&local_d8);
  std::__cxx11::string::append((char *)&local_d8);
  if (!bVar1) {
    bVar3 = cmsys::SystemTools::FileExists(&local_d8,true);
    if (bVar3) {
      bVar2 = CheckVersionFile(this,&local_d8,&local_b8);
      bVar1 = true;
    }
  }
  local_98 = (this->Version)._M_string_length;
  local_70._8_8_ = 0;
  local_70[0x10] = '\0';
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_70._0_8_ = local_70 + 0x10;
  local_50._M_p = (pointer)&local_40;
  std::__cxx11::string::_M_assign((string *)local_70);
  std::__cxx11::string::_M_assign((string *)&local_50);
  std::
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  ::emplace_back<cmFindPackageCommand::ConfigFileInfo>
            (&this->ConsideredConfigs,(ConfigFileInfo *)local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,
                    CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,CONCAT71(local_70._17_7_,local_70[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  bVar3 = true;
  if (local_98 != 0) {
    bVar3 = bVar2;
  }
  if (bVar1) {
    bVar3 = bVar2;
  }
  return bVar3;
}

Assistant:

bool cmFindPackageCommand::CheckVersion(std::string const& config_file)
{
  bool result = false; // by default, assume the version is not ok.
  bool haveResult = false;
  std::string version = "unknown";

  // Get the filename without the .cmake extension.
  std::string::size_type pos = config_file.rfind('.');
  std::string version_file_base = config_file.substr(0, pos);

  // Look for foo-config-version.cmake
  std::string version_file = version_file_base;
  version_file += "-version.cmake";
  if (!haveResult && cmSystemTools::FileExists(version_file, true)) {
    result = this->CheckVersionFile(version_file, version);
    haveResult = true;
  }

  // Look for fooConfigVersion.cmake
  version_file = version_file_base;
  version_file += "Version.cmake";
  if (!haveResult && cmSystemTools::FileExists(version_file, true)) {
    result = this->CheckVersionFile(version_file, version);
    haveResult = true;
  }

  // If no version was requested a versionless package is acceptable.
  if (!haveResult && this->Version.empty()) {
    result = true;
  }

  ConfigFileInfo configFileInfo;
  configFileInfo.filename = config_file;
  configFileInfo.version = version;
  this->ConsideredConfigs.push_back(std::move(configFileInfo));

  return result;
}